

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O1

Address * cfd::ElementsAddressFactory::CreatePegOutAddress
                    (Address *__return_storage_ptr__,NetType mainchain_network,
                    NetType elements_network,string *descriptor_or_xpub,uint32_t bip32_counter,
                    AddressType address_type,Descriptor *base_descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  AddressType AVar7;
  long lVar8;
  long *plVar9;
  CfdException *pCVar10;
  size_type *psVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string index_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string extkey;
  ExtPubkey pk;
  ExtPubkey check_key;
  DescriptorScriptReference ref;
  KeyData derived_key;
  Descriptor desc;
  string local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_958;
  string local_940;
  Extkey local_920;
  Extkey local_890;
  DescriptorNode local_800;
  undefined1 local_690 [72];
  Script local_648;
  Address local_610;
  TapBranch local_488;
  TapBranch local_400;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_360;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_358;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_340;
  undefined1 local_328 [392];
  DescriptorNode local_1a0;
  
  if (2 < (int)mainchain_network) {
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    local_690._0_8_ = local_690 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_690,"Failed to mainchain network type. invalid value.","");
    core::CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)local_690);
    __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (elements_network + ~kCustomChain < 0xfffffffd) {
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    local_690._0_8_ = local_690 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_690,"Failed to elements network type. invalid value.","");
    core::CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)local_690);
    __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  pcVar2 = (descriptor_or_xpub->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_9b8,pcVar2,pcVar2 + descriptor_or_xpub->_M_string_length);
  lVar8 = std::__cxx11::string::find((char *)descriptor_or_xpub,0x627ad7,0);
  if (lVar8 == -1) {
    if (address_type == kP2shP2wpkhAddress) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                     "sh(wpkh(",descriptor_or_xpub);
      plVar9 = (long *)std::__cxx11::string::append(local_328);
    }
    else if (address_type == kP2wpkhAddress) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                     "wpkh(",descriptor_or_xpub);
      plVar9 = (long *)std::__cxx11::string::append(local_328);
    }
    else {
      if (address_type != kP2pkhAddress) goto LAB_003f61ee;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                     "pkh(",descriptor_or_xpub);
      plVar9 = (long *)std::__cxx11::string::append(local_328);
    }
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      local_690._16_8_ = *psVar11;
      local_690._24_8_ = plVar9[3];
      local_690._0_8_ = local_690 + 0x10;
    }
    else {
      local_690._16_8_ = *psVar11;
      local_690._0_8_ = (size_type *)*plVar9;
    }
    local_690._8_8_ = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_9b8,(string *)local_690);
    if ((undefined1 *)local_690._0_8_ != local_690 + 0x10) {
      operator_delete((void *)local_690._0_8_,local_690._16_8_ + 1);
    }
    if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
    }
  }
LAB_003f61ee:
  core::Descriptor::Parse
            ((Descriptor *)&local_1a0,&local_9b8,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kMainnet);
  lVar8 = std::__cxx11::string::find((char *)&local_9b8,0x61f347,0);
  if (lVar8 != -1) {
    std::__cxx11::string::rfind((char *)&local_9b8,0x627ad7,0xffffffffffffffff);
    std::__cxx11::string::find((char *)&local_9b8,0x61f347,0);
    std::__cxx11::string::substr((ulong)&local_940,(ulong)&local_9b8);
    core::ExtPubkey::ExtPubkey((ExtPubkey *)&local_920,&local_940);
    cVar5 = '\x01';
    if (9 < bip32_counter) {
      uVar3 = bip32_counter;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar3 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_003f62d0;
        }
        if (uVar3 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_003f62d0;
        }
        if (uVar3 < 10000) goto LAB_003f62d0;
        bVar6 = 99999 < uVar3;
        uVar3 = uVar3 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar6);
      cVar5 = cVar5 + '\x01';
    }
LAB_003f62d0:
    local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_978,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_978._M_dataplus._M_p,(uint)local_978._M_string_length,bip32_counter);
    pcVar2 = local_690 + 0x10;
    local_690._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_690,local_978._M_dataplus._M_p,
               local_978._M_dataplus._M_p +
               CONCAT44(local_978._M_string_length._4_4_,(uint)local_978._M_string_length));
    __l._M_len = 1;
    __l._M_array = (iterator)local_690;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_958,__l,(allocator_type *)local_328);
    if ((pointer)local_690._0_8_ != pcVar2) {
      operator_delete((void *)local_690._0_8_,local_690._16_8_ + 1);
    }
    core::Descriptor::GetKeyData((KeyData *)local_328,(Descriptor *)&local_1a0,&local_958);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690,
                   "0/",&local_978);
    core::ExtPubkey::DerivePubkey
              ((ExtPubkey *)&local_890,(ExtPubkey *)&local_920,(string *)local_690);
    if ((pointer)local_690._0_8_ != pcVar2) {
      operator_delete((void *)local_690._0_8_,local_690._16_8_ + 1);
    }
    core::KeyData::GetPubkey((Pubkey *)local_690,(KeyData *)local_328);
    core::Extkey::GetPubkey((Pubkey *)&local_800,&local_890);
    bVar6 = core::Pubkey::Equals((Pubkey *)local_690,(Pubkey *)&local_800);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800.name_._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_800.name_._M_dataplus._M_p,
                      local_800.name_.field_2._M_allocated_capacity -
                      (long)local_800.name_._M_dataplus._M_p);
    }
    if ((pointer)local_690._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_690._0_8_,local_690._16_8_ - local_690._0_8_);
    }
    if (!bVar6) {
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      local_690._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_690,
                 "Invalid descriptor format. This path is not support on pegout.","");
      core::CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)local_690);
      __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Descriptor::GetReference
              ((DescriptorScriptReference *)local_690,(Descriptor *)&local_1a0,&local_958);
    core::Extkey::ToString_abi_cxx11_(&local_800.name_,&local_920);
    std::__cxx11::string::operator=((string *)&local_9b8,(string *)&local_800);
    paVar1 = &local_800.name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_800.name_._M_dataplus._M_p,
                      local_800.name_.field_2._M_allocated_capacity + 1);
    }
    AVar7 = core::DescriptorScriptReference::GetAddressType((DescriptorScriptReference *)local_690);
    local_800.name_._M_dataplus._M_p = (pointer)paVar1;
    if (AVar7 == kP2shP2wpkhAddress) {
      std::operator+(&local_998,"sh(wpkh(",&local_9b8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_998);
    }
    else if (AVar7 == kP2wpkhAddress) {
      std::operator+(&local_998,"wpkh(",&local_9b8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_998);
    }
    else {
      if (AVar7 != kP2pkhAddress) {
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_800,
                   "Invalid descriptor. This descriptor type isn\'t support on pegout.","");
        core::CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&local_800.name_);
        __cxa_throw(pCVar10,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::operator+(&local_998,"pkh(",&local_9b8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_998);
    }
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_800.name_.field_2._M_allocated_capacity = *psVar11;
      local_800.name_.field_2._8_8_ = plVar9[3];
    }
    else {
      local_800.name_.field_2._M_allocated_capacity = *psVar11;
      local_800.name_._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_800.name_._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_9b8,(string *)&local_800);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800.name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_800.name_._M_dataplus._M_p,
                      local_800.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_998._M_dataplus._M_p != &local_998.field_2) {
      operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
    }
    core::Descriptor::Parse
              ((Descriptor *)&local_800,&local_9b8,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0,kMainnet);
    core::Descriptor::operator=((Descriptor *)&local_1a0,(Descriptor *)&local_800);
    core::DescriptorNode::~DescriptorNode(&local_800);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_340);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector(&local_358);
    if (local_360._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360._M_pi);
    }
    local_400._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_380);
    core::TapBranch::~TapBranch(&local_400);
    core::TapBranch::~TapBranch(&local_488);
    core::Address::~Address(&local_610);
    core::Script::~Script(&local_648);
    core::Script::~Script((Script *)(local_690 + 8));
    if (local_890.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_890.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_890.tweak_sum_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_890.tweak_sum_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_890.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_890.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_890.pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_890.pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_890.privkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_890.privkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_890.privkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_890.privkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_890.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_890.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_890.chaincode_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_890.chaincode_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_890.fingerprint_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_890.fingerprint_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_890.fingerprint_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_890.fingerprint_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    core::KeyData::~KeyData((KeyData *)local_328);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_958);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_978._M_dataplus._M_p != &local_978.field_2) {
      operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
    }
    if (local_920.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_920.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_920.tweak_sum_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_920.tweak_sum_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_920.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_920.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_920.pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_920.pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_920.privkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_920.privkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_920.privkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_920.privkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_920.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_920.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_920.chaincode_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_920.chaincode_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_920.fingerprint_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_920.fingerprint_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_920.fingerprint_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_920.fingerprint_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_940._M_dataplus._M_p != &local_940.field_2) {
      operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
    }
  }
  core::ConfidentialTransaction::GetPegoutAddressFromDescriptor
            (__return_storage_ptr__,&local_9b8,bip32_counter,mainchain_network,elements_network);
  if (base_descriptor != (Descriptor *)0x0) {
    core::Descriptor::operator=(base_descriptor,(Descriptor *)&local_1a0);
  }
  core::DescriptorNode::~DescriptorNode(&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Address ElementsAddressFactory::CreatePegOutAddress(
    NetType mainchain_network, NetType elements_network,
    const std::string& descriptor_or_xpub, uint32_t bip32_counter,
    AddressType address_type, Descriptor* base_descriptor) {
  if (mainchain_network > NetType::kRegtest) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to mainchain network type. invalid value.");
  }
  if ((elements_network < NetType::kLiquidV1) ||
      (elements_network > NetType::kCustomChain)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to elements network type. invalid value.");
  }

  std::string descriptor = descriptor_or_xpub;
  if (descriptor_or_xpub.find("(") == std::string::npos) {
    if (address_type == AddressType::kP2pkhAddress) {
      descriptor = "pkh(" + descriptor_or_xpub + ")";
    } else if (address_type == AddressType::kP2shP2wpkhAddress) {
      descriptor = "sh(wpkh(" + descriptor_or_xpub + "))";
    } else if (address_type == AddressType::kP2wpkhAddress) {
      descriptor = "wpkh(" + descriptor_or_xpub + ")";
    }
  }

  auto desc = Descriptor::Parse(descriptor);
  if (descriptor.find("/") != std::string::npos) {
    auto start_pos = descriptor.rfind("(") + 1;
    auto end_pos = descriptor.find("/");
    std::string extkey = descriptor.substr(start_pos, end_pos - start_pos);
    ExtPubkey pk(extkey);
    auto index_str = std::to_string(bip32_counter);
    std::vector<std::string> args = {index_str};
    auto derived_key = desc.GetKeyData(args);
    auto check_key = pk.DerivePubkey("0/" + index_str);
    if (!derived_key.GetPubkey().Equals(check_key.GetPubkey())) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid descriptor format. This path is not support on pegout.");
    }

    auto ref = desc.GetReference(&args);
    descriptor = pk.ToString();
    auto addr_type = ref.GetAddressType();
    if (addr_type == AddressType::kP2pkhAddress) {
      descriptor = "pkh(" + descriptor + ")";
    } else if (addr_type == AddressType::kP2shP2wpkhAddress) {
      descriptor = "sh(wpkh(" + descriptor + "))";
    } else if (addr_type == AddressType::kP2wpkhAddress) {
      descriptor = "wpkh(" + descriptor + ")";
    } else {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid descriptor. This descriptor type isn't support on pegout.");
    }
    desc = Descriptor::Parse(descriptor);
  }

  auto addr = ConfidentialTransaction::GetPegoutAddressFromDescriptor(
      descriptor, bip32_counter, mainchain_network, elements_network);
  if (base_descriptor != nullptr) *base_descriptor = desc;
  return addr;
}